

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

Vector<tcu::Vector<float,_2>,_3> *
deqp::gles3::Functional::calculateLodDerivateParts
          (Vector<tcu::Vector<float,_2>,_3> *__return_storage_ptr__,Mat4 *transformation)

{
  int row;
  long lVar1;
  float *pfVar2;
  long lVar3;
  float v;
  float fVar4;
  Vector<float,_4> res;
  Vec3 trans10;
  Vec3 trans01;
  Vector<float,_4> *local_38;
  float local_30 [4];
  Vec3 trans00;
  float local_10 [2];
  undefined1 *puStack_8;
  
  local_10[0] = 0.0;
  local_10[1] = 0.0;
  puStack_8 = &DAT_3f8000003f800000;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar1 = 0;
  pfVar2 = (float *)transformation;
  do {
    fVar4 = 0.0;
    lVar3 = 0;
    do {
      fVar4 = fVar4 + pfVar2[lVar3] * *(float *)((long)local_10 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
    res.m_data[lVar1] = fVar4;
    lVar1 = lVar1 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar1 != 4);
  local_38 = &res;
  local_30[0] = 0.0;
  local_30[1] = 1.4013e-45;
  local_30[2] = 2.8026e-45;
  trans00.m_data[0] = 0.0;
  trans00.m_data[1] = 0.0;
  trans00.m_data[2] = 0.0;
  lVar1 = 2;
  do {
    local_30[lVar1 + 2] = res.m_data[*(int *)((long)&local_38 + lVar1 * 4)];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  local_10[0] = 0.0;
  local_10[1] = 1.0;
  puStack_8 = &DAT_3f8000003f800000;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar1 = 0;
  pfVar2 = (float *)transformation;
  do {
    fVar4 = 0.0;
    lVar3 = 0;
    do {
      fVar4 = fVar4 + pfVar2[lVar3] * *(float *)((long)local_10 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
    res.m_data[lVar1] = fVar4;
    lVar1 = lVar1 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar1 != 4);
  local_30[0] = 0.0;
  local_30[1] = 1.4013e-45;
  local_30[2] = 2.8026e-45;
  lVar1 = 2;
  do {
    trans10.m_data[lVar1 + 2] = res.m_data[*(int *)((long)&local_38 + lVar1 * 4)];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  local_10[0] = 1.0;
  local_10[1] = 0.0;
  puStack_8 = &DAT_3f8000003f800000;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar1 = 0;
  do {
    fVar4 = 0.0;
    lVar3 = 0;
    do {
      fVar4 = fVar4 + *(float *)((long)transformation + lVar3 * 4) *
                      *(float *)((long)local_10 + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
    res.m_data[lVar1] = fVar4;
    lVar1 = lVar1 + 1;
    transformation = (Mat4 *)((long)transformation + 4);
  } while (lVar1 != 4);
  local_30[0] = 0.0;
  local_30[1] = 1.4013e-45;
  local_30[2] = 2.8026e-45;
  trans10.m_data[0] = 0.0;
  trans10.m_data[1] = 0.0;
  trans10.m_data[2] = 0.0;
  lVar1 = 2;
  do {
    res.m_data[lVar1 + 2] = res.m_data[*(int *)((long)&local_38 + lVar1 * 4)];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  *(undefined8 *)__return_storage_ptr__->m_data[0].m_data = 0;
  *(undefined8 *)__return_storage_ptr__->m_data[1].m_data = 0;
  *(undefined8 *)__return_storage_ptr__->m_data[2].m_data = 0;
  __return_storage_ptr__->m_data[0].m_data[0] = trans10.m_data[0] - trans00.m_data[0];
  __return_storage_ptr__->m_data[0].m_data[1] = 0.0 - trans00.m_data[0];
  __return_storage_ptr__->m_data[1].m_data[0] = trans10.m_data[1] - trans00.m_data[1];
  __return_storage_ptr__->m_data[1].m_data[1] = 0.0 - trans00.m_data[1];
  __return_storage_ptr__->m_data[2].m_data[0] = trans10.m_data[2] - trans00.m_data[2];
  __return_storage_ptr__->m_data[2].m_data[1] = 0.0 - trans00.m_data[2];
  return __return_storage_ptr__;
}

Assistant:

static tcu::Vector<tcu::Vec2, 3> calculateLodDerivateParts (const Mat4& transformation)
{
	// Calculate transformed coordinates of three screen corners.
	Vec3 trans00 = (transformation * Vec4(0.0f, 0.0f, 1.0f, 1.0f)).xyz();
	Vec3 trans01 = (transformation * Vec4(0.0f, 1.0f, 1.0f, 1.0f)).xyz();
	Vec3 trans10 = (transformation * Vec4(1.0f, 0.0f, 1.0f, 1.0f)).xyz();

	return tcu::Vector<tcu::Vec2, 3>(Vec2(trans10.x() - trans00.x(), trans01.x() - trans00.x()),
									 Vec2(trans10.y() - trans00.y(), trans01.y() - trans00.y()),
									 Vec2(trans10.z() - trans00.z(), trans01.z() - trans00.z()));
}